

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::GreaterThanEquals,true,false,false,true>
                (uhugeint_t *ldata,uhugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uhugeint_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = 0;
  uVar9 = 0;
  lVar5 = 0;
  do {
    if (uVar4 == count + 0x3f >> 6) {
      return count - lVar5;
    }
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar7 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar7 = count;
      }
LAB_01854956:
      puVar6 = rdata + uVar9;
      for (; uVar9 < uVar7; uVar9 = uVar9 + 1) {
        uVar10 = uVar9;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)sel->sel_vector[uVar9];
        }
        bVar2 = GreaterThanEquals::Operation<duckdb::uhugeint_t>(ldata,puVar6);
        false_sel->sel_vector[lVar5] = (sel_t)uVar10;
        lVar5 = lVar5 + (ulong)!bVar2;
        puVar6 = puVar6 + 1;
      }
    }
    else {
      uVar10 = puVar1[uVar4];
      uVar7 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar7 = count;
      }
      if (uVar10 == 0xffffffffffffffff) goto LAB_01854956;
      uVar8 = uVar9;
      if (uVar10 == 0) {
        for (; uVar9 = uVar7, uVar8 < uVar7; uVar8 = uVar8 + 1) {
          uVar9 = uVar8;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar8];
          }
          false_sel->sel_vector[lVar5] = (sel_t)uVar9;
          lVar5 = lVar5 + 1;
        }
      }
      else {
        puVar6 = rdata + uVar9;
        uVar8 = 0;
        for (; uVar9 < uVar7; uVar9 = uVar9 + 1) {
          uVar11 = uVar9;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)sel->sel_vector[uVar9];
          }
          uVar3 = 1;
          if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
            bVar2 = GreaterThanEquals::Operation<duckdb::uhugeint_t>(ldata,puVar6);
            uVar3 = (ulong)!bVar2;
          }
          false_sel->sel_vector[lVar5] = (sel_t)uVar11;
          lVar5 = lVar5 + uVar3;
          uVar8 = uVar8 + 1;
          puVar6 = puVar6 + 1;
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}